

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::shrink_to_fit(Buffer *this,off_t len)

{
  long lVar1;
  char *pcVar2;
  off_t oVar3;
  char *pcVar4;
  size_t __n;
  ulong uVar5;
  
  oVar3 = size(this);
  if (len < oVar3) {
    oVar3 = size(this);
    shrink(this,oVar3);
    return;
  }
  lVar1 = this->leftIndex_;
  if (len < this->capacity_ - lVar1) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < lVar1 + len) {
      uVar5 = lVar1 + len;
    }
    pcVar4 = (char *)operator_new__(uVar5);
    pcVar2 = this->buffer_;
    __n = size(this);
    memcpy(pcVar4 + lVar1,pcVar2 + lVar1,__n);
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->buffer_ = pcVar4;
    this->capacity_ = len + this->leftIndex_;
  }
  return;
}

Assistant:

void Buffer::shrink_to_fit(off_t len) {
    if (len < size()) {
        shrink(size());
    } else if (len < capacity_ - leftIndex_) {
        char *newBuffer = new char[len + leftIndex_];
        ::memcpy(newBuffer + leftIndex_, buffer_ + leftIndex_, size());
        delete[] buffer_;
        buffer_ = newBuffer;
        capacity_ = len + leftIndex_;
    }
}